

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O3

void __thiscall
ValidationSignalsImpl::Register
          (ValidationSignalsImpl *this,shared_ptr<CValidationInterface> callbacks)

{
  size_t *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  element_type *peVar5;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false,_false>,_bool>
  pVar6;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  unique_lock<std::mutex> local_40;
  long local_30;
  
  peVar5 = callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_owns = false;
  local_40._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_40);
  pVar6 = std::
          _Hashtable<CValidationInterface*,std::pair<CValidationInterface*const,std::_List_iterator<ValidationSignalsImpl::ListEntry>>,std::allocator<std::pair<CValidationInterface*const,std::_List_iterator<ValidationSignalsImpl::ListEntry>>>,std::__detail::_Select1st,std::equal_to<CValidationInterface*>,std::hash<CValidationInterface*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<CValidationInterface*,std::_List_iterator<ValidationSignalsImpl::ListEntry>>
                    ((_Hashtable<CValidationInterface*,std::pair<CValidationInterface*const,std::_List_iterator<ValidationSignalsImpl::ListEntry>>,std::allocator<std::pair<CValidationInterface*const,std::_List_iterator<ValidationSignalsImpl::ListEntry>>>,std::__detail::_Select1st,std::equal_to<CValidationInterface*>,std::hash<CValidationInterface*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->m_map);
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    p_Var4 = *(_List_node_base **)
              ((long)pVar6.first.
                     super__Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
              + 0x10);
  }
  else {
    p_Var4 = (_List_node_base *)operator_new(0x28);
    p_Var4[1]._M_next = (_List_node_base *)0x0;
    p_Var4[1]._M_prev = (_List_node_base *)0x0;
    p_Var4[2]._M_next = (_List_node_base *)0x0;
    *(undefined4 *)&p_Var4[2]._M_next = 1;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(this->m_list).
              super__List_base<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    *(_List_node_base **)
     ((long)pVar6.first.
            super__Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
     + 0x10) = p_Var4;
  }
  p_Var2 = (_List_node_base *)peVar5->_vptr_CValidationInterface;
  p_Var3 = (_List_node_base *)peVar5[1]._vptr_CValidationInterface;
  peVar5->_vptr_CValidationInterface = (_func_int **)0x0;
  peVar5[1]._vptr_CValidationInterface = (_func_int **)0x0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_prev;
  p_Var4[1]._M_next = p_Var2;
  p_Var4[1]._M_prev = p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        LOCK(m_mutex);
        auto inserted = m_map.emplace(callbacks.get(), m_list.end());
        if (inserted.second) inserted.first->second = m_list.emplace(m_list.end());
        inserted.first->second->callbacks = std::move(callbacks);
    }